

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O2

void trace2(Abc_Obj_t *pObj)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  Abc_Obj_t *pObj_00;
  
  do {
    pObj_00 = pObj;
    print_node(pObj_00);
    uVar1 = (pObj_00->vFanins).nSize;
    uVar2 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar2 = 0;
    }
    uVar3 = 0;
    do {
      if (uVar2 == uVar3) {
        return;
      }
      pObj = (Abc_Obj_t *)pObj_00->pNtk->vObjs->pArray[(pObj_00->vFanins).pArray[uVar3]];
      uVar3 = uVar3 + 1;
    } while ((int)(*(uint *)&pObj->field_0x14 >> 0xc) <
             (int)((*(uint *)&pObj_00->field_0x14 >> 0xc) - 1));
  } while( true );
}

Assistant:

void trace2(Abc_Obj_t *pObj) {
  Abc_Obj_t *pNext;
  int i;

  print_node(pObj);
  Abc_ObjForEachFanin(pObj, pNext, i) 
    if (pNext->Level >= pObj->Level - 1) {
      trace2(pNext);
      break;
    }
}